

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_asm_x86.h
# Opt level: O2

void asm_setupresult(ASMState *as,IRIns *ir,CCallInfo *ci)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  Reg r;
  uint uVar4;
  ulong uVar5;
  
  bVar2 = (ir->field_1).r & 0x1f;
  uVar4 = 0xffff0fc7;
  if (-1 < (char)(ir->field_1).r) {
    uVar4 = -2 << bVar2 | 0xfffffffeU >> 0x20 - bVar2;
  }
  ra_evictset(as,uVar4 & (ci->flags & 0x400) * 0x40 - 0xf039);
  bVar2 = (ir->field_1).r;
  if (((char)bVar2 < '\0') && ((ir->field_1).s == '\0')) {
    return;
  }
  if ((byte)(((ir->field_1).t.irt & 0x1f) - 0xd) < 2) {
    if ((ci->flags & 0x200) != 0) {
      bVar1 = (ir->field_1).s;
      if (-1 < (char)bVar2) {
        iVar3 = 1 << (bVar2 & 0x1f);
        uVar5._0_4_ = as->freeset;
        uVar5._4_4_ = as->modset;
        uVar5 = CONCAT44(iVar3,iVar3) | uVar5;
        as->freeset = (int)uVar5;
        as->modset = (int)(uVar5 >> 0x20);
        emit_rr(as,XO_MOVD,(int)(char)bVar2 | 0x80200,0);
      }
      if (bVar1 == 0) {
        return;
      }
      emit_rmro(as,XO_MOVto,0x80200,4,(uint)bVar1 << 2);
      return;
    }
    r = 0x10;
  }
  else {
    r = 0;
  }
  ra_destreg(as,ir,r);
  return;
}

Assistant:

static void asm_setupresult(ASMState *as, IRIns *ir, const CCallInfo *ci)
{
  RegSet drop = RSET_SCRATCH;
  int hiop = (LJ_32 && (ir+1)->o == IR_HIOP && !irt_isnil((ir+1)->t));
  if ((ci->flags & CCI_NOFPRCLOBBER))
    drop &= ~RSET_FPR;
  if (ra_hasreg(ir->r))
    rset_clear(drop, ir->r);  /* Dest reg handled below. */
  if (hiop && ra_hasreg((ir+1)->r))
    rset_clear(drop, (ir+1)->r);  /* Dest reg handled below. */
  ra_evictset(as, drop);  /* Evictions must be performed first. */
  if (ra_used(ir)) {
    if (irt_isfp(ir->t)) {
      int32_t ofs = sps_scale(ir->s);  /* Use spill slot or temp slots. */
#if LJ_64
      if ((ci->flags & CCI_CASTU64)) {
	Reg dest = ir->r;
	if (ra_hasreg(dest)) {
	  ra_free(as, dest);
	  ra_modified(as, dest);
	  emit_rr(as, XO_MOVD, dest|REX_64, RID_RET);  /* Really MOVQ. */
	}
	if (ofs) emit_movtomro(as, RID_RET|REX_64, RID_ESP, ofs);
      } else {
	ra_destreg(as, ir, RID_FPRET);
      }
#else
      /* Number result is in x87 st0 for x86 calling convention. */
      Reg dest = ir->r;
      if (ra_hasreg(dest)) {
	ra_free(as, dest);
	ra_modified(as, dest);
	emit_rmro(as, irt_isnum(ir->t) ? XO_MOVSD : XO_MOVSS,
		  dest, RID_ESP, ofs);
      }
      if ((ci->flags & CCI_CASTU64)) {
	emit_movtomro(as, RID_RETLO, RID_ESP, ofs);
	emit_movtomro(as, RID_RETHI, RID_ESP, ofs+4);
      } else {
	emit_rmro(as, irt_isnum(ir->t) ? XO_FSTPq : XO_FSTPd,
		  irt_isnum(ir->t) ? XOg_FSTPq : XOg_FSTPd, RID_ESP, ofs);
      }
#endif
#if LJ_32
    } else if (hiop) {
      ra_destpair(as, ir);
#endif
    } else {
      lj_assertA(!irt_ispri(ir->t), "PRI dest");
      ra_destreg(as, ir, RID_RET);
    }
  } else if (LJ_32 && irt_isfp(ir->t) && !(ci->flags & CCI_CASTU64)) {
    emit_x87op(as, XI_FPOP);  /* Pop unused result from x87 st0. */
  }
}